

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_ManSimProfile(Gia_Man_t *pGia)

{
  int nWords;
  uint uVar1;
  uint uVar2;
  Vec_Wrd_t *vSims;
  int nC1s;
  int nC0s;
  uint local_38;
  uint local_34;
  
  vSims = Gia_ManSimPatSim(pGia);
  nWords = vSims->nSize / pGia->nObjs;
  local_34 = 0;
  local_38 = 0;
  uVar1 = Gia_ManSimPatHashPatterns(pGia,nWords,vSims,(int *)&local_34,(int *)&local_38);
  uVar2 = Gia_ManCandNum(pGia);
  printf("Simulating %d patterns leads to %d unique objects (%.2f %% out of %d), Const0 = %d. Const1 = %d.\n"
         ,((double)(int)uVar1 * 100.0) / (double)(int)uVar2,(ulong)(uint)(nWords << 6),(ulong)uVar1,
         (ulong)uVar2,(ulong)local_34,(ulong)local_38);
  Vec_WrdFree(vSims);
  return;
}

Assistant:

void Gia_ManSimProfile( Gia_Man_t * pGia )
{
    Vec_Wrd_t * vSims = Gia_ManSimPatSim( pGia );
    int nWords = Vec_WrdSize(vSims) / Gia_ManObjNum(pGia);
    int nC0s = 0, nC1s = 0, nUnique = Gia_ManSimPatHashPatterns( pGia, nWords, vSims, &nC0s, &nC1s );
    printf( "Simulating %d patterns leads to %d unique objects (%.2f %% out of %d), Const0 = %d. Const1 = %d.\n", 
        64*nWords, nUnique, 100.0*nUnique/Gia_ManCandNum(pGia), Gia_ManCandNum(pGia), nC0s, nC1s );
    Vec_WrdFree( vSims );
}